

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::ContentEncoding::ParseEncryptionEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentEncryption *encryption)

{
  uchar **ppuVar1;
  uchar **ppuVar2;
  uchar **ppuVar3;
  int iVar4;
  long lVar5;
  uchar *puVar6;
  unsigned_long_long uVar7;
  longlong lVar8;
  longlong lVar9;
  ContentEncoding *this_00;
  long stop;
  longlong pos;
  longlong size_1;
  uchar **local_58;
  uchar **local_50;
  uchar **local_48;
  ContentEncAESSettings *local_40;
  longlong id;
  
  stop = size + start;
  local_40 = &encryption->aes_settings;
  local_48 = &encryption->sig_key_id;
  local_50 = &encryption->signature;
  local_58 = &encryption->key_id;
  pos = start;
  do {
    if (stop <= pos) {
      return 0;
    }
    this_00 = (ContentEncoding *)pReader;
    lVar5 = ParseElementHeader(pReader,&pos,stop,&id,&size_1);
    ppuVar3 = local_48;
    ppuVar2 = local_50;
    ppuVar1 = local_58;
    lVar9 = size_1;
    lVar8 = pos;
    if (lVar5 < 0) {
      return lVar5;
    }
    switch(id) {
    case 0x47e1:
      uVar7 = UnserializeUInt(pReader,pos,size_1);
      encryption->algo = uVar7;
      if (uVar7 != 5) {
        return -2;
      }
      break;
    case 0x47e2:
      if (*local_58 != (uchar *)0x0) {
        operator_delete__(*local_58);
      }
      lVar9 = size_1;
      *ppuVar1 = (uchar *)0x0;
      ppuVar1[1] = (uchar *)0x0;
      if (size_1 < 1) {
        return -2;
      }
      puVar6 = SafeArrayAlloc<unsigned_char>(1,size_1);
      lVar8 = pos;
      if (puVar6 == (uchar *)0x0) {
        return -1;
      }
      iVar4 = (**pReader->_vptr_IMkvReader)(pReader,pos,lVar9,puVar6);
      if (iVar4 != 0) {
LAB_0015b74b:
        operator_delete__(puVar6);
        return 0;
      }
      encryption->key_id = puVar6;
      encryption->key_id_len = lVar9;
      break;
    case 0x47e3:
      if (*local_50 != (uchar *)0x0) {
        operator_delete__(*local_50);
      }
      lVar9 = size_1;
      *ppuVar2 = (uchar *)0x0;
      ppuVar2[1] = (uchar *)0x0;
      if (size_1 < 1) {
        return -2;
      }
      puVar6 = SafeArrayAlloc<unsigned_char>(1,size_1);
      lVar8 = pos;
      if (puVar6 == (uchar *)0x0) {
        return -1;
      }
      iVar4 = (**pReader->_vptr_IMkvReader)(pReader,pos,lVar9,puVar6);
      if (iVar4 != 0) goto LAB_0015b74b;
      encryption->signature = puVar6;
      encryption->signature_len = lVar9;
      break;
    case 0x47e4:
      if (*local_48 != (uchar *)0x0) {
        operator_delete__(*local_48);
      }
      lVar9 = size_1;
      *ppuVar3 = (uchar *)0x0;
      ppuVar3[1] = (uchar *)0x0;
      if (size_1 < 1) {
        return -2;
      }
      puVar6 = SafeArrayAlloc<unsigned_char>(1,size_1);
      lVar8 = pos;
      if (puVar6 == (uchar *)0x0) {
        return -1;
      }
      iVar4 = (**pReader->_vptr_IMkvReader)(pReader,pos,lVar9,puVar6);
      if (iVar4 != 0) goto LAB_0015b74b;
      encryption->sig_key_id = puVar6;
      encryption->sig_key_id_len = lVar9;
      break;
    case 0x47e5:
      uVar7 = UnserializeUInt(pReader,pos,size_1);
      encryption->sig_algo = uVar7;
      break;
    case 0x47e6:
      uVar7 = UnserializeUInt(pReader,pos,size_1);
      encryption->sig_hash_algo = uVar7;
      break;
    case 0x47e7:
      lVar5 = ParseContentEncAESSettingsEntry(this_00,pos,size_1,pReader,local_40);
      if (lVar5 != 0) {
        return lVar5;
      }
    }
    pos = lVar8 + lVar9;
    if (stop < pos) {
      return -2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseEncryptionEntry(long long start, long long size,
                                           IMkvReader* pReader,
                                           ContentEncryption* encryption) {
  assert(pReader);
  assert(encryption);

  long long pos = start;
  const long long stop = start + size;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncAlgo) {
      encryption->algo = UnserializeUInt(pReader, pos, size);
      if (encryption->algo != 5)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvContentEncKeyID) {
      delete[] encryption->key_id;
      encryption->key_id = NULL;
      encryption->key_id_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->key_id = buf;
      encryption->key_id_len = buflen;
    } else if (id == libwebm::kMkvContentSignature) {
      delete[] encryption->signature;
      encryption->signature = NULL;
      encryption->signature_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->signature = buf;
      encryption->signature_len = buflen;
    } else if (id == libwebm::kMkvContentSigKeyID) {
      delete[] encryption->sig_key_id;
      encryption->sig_key_id = NULL;
      encryption->sig_key_id_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->sig_key_id = buf;
      encryption->sig_key_id_len = buflen;
    } else if (id == libwebm::kMkvContentSigAlgo) {
      encryption->sig_algo = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentSigHashAlgo) {
      encryption->sig_hash_algo = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncAESSettings) {
      const long status = ParseContentEncAESSettingsEntry(
          pos, size, pReader, &encryption->aes_settings);
      if (status)
        return status;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;
}